

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp.cpp
# Opt level: O0

Factor * __thiscall libDAI::BP::belief(BP *this,VarSet *ns)

{
  bool bVar1;
  size_type sVar2;
  reference pVVar3;
  long *plVar4;
  TFactor<double> *pTVar5;
  long *in_RSI;
  Factor *in_RDI;
  size_t I;
  size_t in_stack_000000b0;
  BP *in_stack_000000b8;
  VarSet *in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffffcf;
  VarSet *in_stack_ffffffffffffffd0;
  TFactor<double> *this_00;
  TFactor<double> *this_01;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  local_20 [4];
  
  sVar2 = VarSet::size((VarSet *)0xb21a16);
  if (sVar2 == 1) {
    local_20[0]._M_current = (Var *)VarSet::begin(in_stack_ffffffffffffff68);
    pVVar3 = __gnu_cxx::
             __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
             ::operator*(local_20);
    (**(code **)(*in_RSI + 0x50))(in_RDI,in_RSI,pVVar3);
  }
  else {
    this_00 = (TFactor<double> *)0x0;
    while( true ) {
      this_01 = this_00;
      plVar4 = (long *)(**(code **)(*in_RSI + 0x20))();
      pTVar5 = (TFactor<double> *)(**(code **)(*plVar4 + 0x48))();
      if (pTVar5 <= this_00) break;
      plVar4 = (long *)(**(code **)(*in_RSI + 0x20))();
      pTVar5 = (TFactor<double> *)(**(code **)(*plVar4 + 0x50))(plVar4,this_01);
      TFactor<double>::vars(pTVar5);
      bVar1 = VarSet::operator>>(&this_00->_vs,in_stack_ffffffffffffff68);
      if (bVar1) break;
      this_00 = (TFactor<double> *)
                ((long)&(this_01->_vs)._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start + 1);
    }
    beliefF(in_stack_000000b8,in_stack_000000b0);
    TFactor<double>::marginal(this_01,in_stack_ffffffffffffffd0,(bool)in_stack_ffffffffffffffcf);
    TFactor<double>::~TFactor(this_00);
  }
  return in_RDI;
}

Assistant:

Factor BP::belief( const VarSet &ns ) const {
        if( ns.size() == 1 )
            return belief( *(ns.begin()) );
        else {
            size_t I;
            for( I = 0; I < grm().nrFactors(); I++ )
                if( grm().factor(I).vars() >> ns )
                    break;
            assert( I != grm().nrFactors() );
            return beliefF(I).marginal(ns);
        }
    }